

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_chk2cmp2_8_pcix(void)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar9 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar9 = pmmu_translate_addr(uVar9);
  }
  uVar3 = m68k_read_memory_16(uVar9 & m68ki_cpu.address_mask);
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
  m68ki_address_space = 2;
  uVar4 = m68ki_get_ea_ix(m68ki_cpu.pc);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar9 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar9 = pmmu_translate_addr(uVar4);
  }
  uVar5 = m68k_read_memory_8(uVar9 & m68ki_cpu.address_mask);
  uVar4 = uVar4 + 1;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar6 = m68k_read_memory_8(uVar4 & m68ki_cpu.address_mask);
  uVar7 = (uint)(char)bVar1;
  if ((short)uVar3 < 0) {
    uVar7 = (uint)bVar1;
  }
  m68ki_cpu.not_z_flag = (uint)(uVar5 != uVar7 && uVar6 != uVar7);
  if ((int)uVar6 < (int)uVar5) {
    bVar8 = (int)uVar6 < (int)uVar7;
    bVar2 = (int)uVar7 < (int)uVar5;
  }
  else {
    bVar8 = (int)uVar7 < (int)uVar5;
    bVar2 = (int)uVar6 < (int)uVar7;
  }
  m68ki_cpu.c_flag = (uint)(byte)(bVar2 | bVar8) << 8;
  if (((uVar3 >> 0xb & 1) != 0) && ((bVar2 | bVar8) != 0)) {
    m68ki_exception_trap(6);
    return;
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_8_pcix(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xff;
		uint ea = EA_PCIX_8();
		sint lower_bound = m68ki_read_pcrel_8(ea);
		sint upper_bound = m68ki_read_pcrel_8(ea + 1);

		if(!BIT_F(word2))
			compare = (int32)(int8)compare;
		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||, faster operation short circuits

    FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;

	}
	m68ki_exception_illegal();
}